

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleBuilder.cpp
# Opt level: O2

void __thiscall
Refal2::CModuleBuilder::SetOrdinary(CModuleBuilder *this,CToken *nameToken,CRulePtr *firstRule)

{
  bool bVar1;
  CPreparatoryFunction *function;
  
  bVar1 = checkModuleExist(this,nameToken);
  if (bVar1) {
    function = addFunction(this,nameToken);
    bVar1 = checkOnlyDeclared(this,function,nameToken);
    if (bVar1) {
      CPreparatoryFunction::SetDefined(function,nameToken);
      CPreparatoryFunction::SetOrdinary(function,firstRule);
      return;
    }
  }
  return;
}

Assistant:

void CModuleBuilder::SetOrdinary( const CToken& nameToken, CRulePtr& firstRule )
{
	if( !checkModuleExist( nameToken ) ) {
		return;
	}
	CPreparatoryFunction& function = addFunction( nameToken );
	if( checkOnlyDeclared( function, nameToken ) ) {
		function.SetDefined( nameToken );
		function.SetOrdinary( firstRule );
	}
}